

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall
dg::LLVMPointerAnalysis::LLVMPointerAnalysis
          (LLVMPointerAnalysis *this,LLVMPointerAnalysisOptions *opts)

{
  LLVMPointerAnalysisOptions *in_RSI;
  undefined8 *in_RDI;
  LLVMPointerAnalysisOptions *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR___cxa_pure_virtual_001847e0;
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

LLVMPointerAnalysis(LLVMPointerAnalysisOptions opts)
            : options(std::move(opts)){}